

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O3

int __thiscall Centaurus::Grammar<wchar_t>::get_machine_id(Grammar<wchar_t> *this,Identifier *id)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_networks)._M_h,id);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(int *)((long)cVar1.
                          super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_true>
                          ._M_cur + 0x50);
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

int get_machine_id(const Identifier& id) const
	{
		return m_networks.at(id).get_unique_id();
	}